

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_rules.hpp
# Opt level: O0

void ovf::detail::parse::ovf_file_action<ovf::detail::parse::version_number>::
     apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,char_const*>>>
               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>_>
                *in,ovf_file *file)

{
  int iVar1;
  string local_38;
  ovf_file *local_18;
  ovf_file *file_local;
  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>_>
  *in_local;
  
  local_18 = file;
  file_local = (ovf_file *)in;
  tao::pegtl::internal::
  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,char_const*>>
  ::string_abi_cxx11_(&local_38,in);
  iVar1 = std::__cxx11::stoi(&local_38,(size_t *)0x0,10);
  local_18->version = iVar1;
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

static void apply( const Input& in, ovf_file & file )
        {
            file.version = std::stoi(in.string());
        }